

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateVectorExtractDynamic(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  int32_t iVar3;
  uint32_t uVar4;
  uint id;
  DiagnosticStream *pDVar5;
  DiagnosticStream local_970;
  DiagnosticStream local_798;
  Instruction *local_5c0;
  Instruction *index;
  DiagnosticStream local_3e0;
  Op local_208;
  uint32_t local_204;
  Op vector_opcode;
  uint32_t vector_type;
  Op local_28;
  uint32_t local_24;
  Op result_opcode;
  uint32_t result_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _result_opcode = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::type_id(inst);
  local_28 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,local_24);
  iVar3 = spvOpcodeIsScalarType(local_28);
  if (iVar3 == 0) {
    ValidationState_t::diag
              ((DiagnosticStream *)&vector_opcode,(ValidationState_t *)inst_local,
               SPV_ERROR_INVALID_DATA,_result_opcode);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&vector_opcode,
                        (char (*) [41])"Expected Result Type to be a scalar type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&vector_opcode);
  }
  else {
    local_204 = ValidationState_t::GetOperandTypeId
                          ((ValidationState_t *)inst_local,_result_opcode,2);
    local_208 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,local_204);
    if (local_208 == OpTypeVector) {
      uVar4 = ValidationState_t::GetComponentType((ValidationState_t *)inst_local,local_204);
      pIVar1 = inst_local;
      if (uVar4 == local_24) {
        id = Instruction::GetOperandAs<unsigned_int>(_result_opcode,3);
        local_5c0 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,id);
        if ((local_5c0 != (Instruction *)0x0) &&
           (uVar4 = Instruction::type_id(local_5c0), pIVar1 = inst_local, uVar4 != 0)) {
          uVar4 = Instruction::type_id(local_5c0);
          bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)pIVar1,uVar4);
          if (bVar2) {
            bVar2 = ValidationState_t::HasCapability
                              ((ValidationState_t *)inst_local,CapabilityShader);
            pIVar1 = inst_local;
            if (bVar2) {
              uVar4 = Instruction::type_id(_result_opcode);
              bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                ((ValidationState_t *)pIVar1,uVar4);
              if (bVar2) {
                ValidationState_t::diag
                          (&local_970,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                           _result_opcode);
                pDVar5 = DiagnosticStream::operator<<
                                   (&local_970,
                                    (char (*) [51])
                                    "Cannot extract from a vector of 8- or 16-bit types");
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
                DiagnosticStream::~DiagnosticStream(&local_970);
                return __local._4_4_;
              }
            }
            return SPV_SUCCESS;
          }
        }
        ValidationState_t::diag
                  (&local_798,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_opcode)
        ;
        pDVar5 = DiagnosticStream::operator<<
                           (&local_798,(char (*) [32])"Expected Index to be int scalar");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream(&local_798);
      }
      else {
        ValidationState_t::diag
                  ((DiagnosticStream *)&index,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA
                   ,_result_opcode);
        pDVar5 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)&index,
                            (char (*) [58])
                            "Expected Vector component type to be equal to Result Type");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&index);
      }
    }
    else {
      ValidationState_t::diag
                (&local_3e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_opcode);
      pDVar5 = DiagnosticStream::operator<<
                         (&local_3e0,(char (*) [40])"Expected Vector type to be OpTypeVector");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream(&local_3e0);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateVectorExtractDynamic(ValidationState_t& _,
                                          const Instruction* inst) {
  const uint32_t result_type = inst->type_id();
  const spv::Op result_opcode = _.GetIdOpcode(result_type);
  if (!spvOpcodeIsScalarType(result_opcode)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Result Type to be a scalar type";
  }

  const uint32_t vector_type = _.GetOperandTypeId(inst, 2);
  const spv::Op vector_opcode = _.GetIdOpcode(vector_type);
  if (vector_opcode != spv::Op::OpTypeVector) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Vector type to be OpTypeVector";
  }

  if (_.GetComponentType(vector_type) != result_type) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Vector component type to be equal to Result Type";
  }

  const auto index = _.FindDef(inst->GetOperandAs<uint32_t>(3));
  if (!index || index->type_id() == 0 || !_.IsIntScalarType(index->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Index to be int scalar";
  }

  if (_.HasCapability(spv::Capability::Shader) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Cannot extract from a vector of 8- or 16-bit types";
  }
  return SPV_SUCCESS;
}